

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void Omega_h::fill_linear<long>(Write<long> *a,long offset,long stride)

{
  undefined1 local_58 [8];
  type_conflict1 f;
  long stride_local;
  long offset_local;
  Write<long> *a_local;
  ulong local_10;
  
  f.stride = stride;
  Write<long>::Write((Write<long> *)local_58,(Write<int> *)a);
  f.offset = f.stride;
  if (((ulong)(a->shared_alloc_).alloc & 1) == 0) {
    local_10 = ((a->shared_alloc_).alloc)->size;
  }
  else {
    local_10 = (ulong)(a->shared_alloc_).alloc >> 3;
  }
  f.a.shared_alloc_.direct_ptr = (void *)offset;
  parallel_for<Omega_h::fill_linear<long>(Omega_h::Write<long>,long,long)::_lambda(int)_1_>
            ((LO)(local_10 >> 3),(type_conflict1 *)local_58,"Write(size,offset,stride)");
  fill_linear<long>(Omega_h::Write<long>,long,long)::{lambda(int)#1}::~Write
            ((_lambda_int__1_ *)local_58);
  return;
}

Assistant:

void fill_linear(Write<T> a, T offset, T stride) {
  auto f = OMEGA_H_LAMBDA(LO i) {
    a[i] = offset + (stride * static_cast<T>(i));
  };
  parallel_for(a.size(), f, "Write(size,offset,stride)");
}